

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h1.c
# Opt level: O0

int rops_write_role_protocol_h1(lws *wsi,uchar *buf,size_t len,lws_write_protocol *wp)

{
  int n;
  size_t olen;
  lws_write_protocol *wp_local;
  size_t len_local;
  uchar *buf_local;
  lws *wsi_local;
  
  wsi_local._4_4_ = lws_issue_raw(wsi,buf,len);
  if (-1 < wsi_local._4_4_) {
    wsi_local._4_4_ = (int)len;
  }
  return wsi_local._4_4_;
}

Assistant:

static int
rops_write_role_protocol_h1(struct lws *wsi, unsigned char *buf, size_t len,
			    enum lws_write_protocol *wp)
{
	size_t olen = len;
	int n;

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
	if (wsi->http.lcs && (((*wp) & 0x1f) == LWS_WRITE_HTTP_FINAL ||
			      ((*wp) & 0x1f) == LWS_WRITE_HTTP)) {
		unsigned char mtubuf[1500 + LWS_PRE +
				     LWS_HTTP_CHUNK_HDR_MAX_SIZE +
				     LWS_HTTP_CHUNK_TRL_MAX_SIZE],
			      *out = mtubuf + LWS_PRE +
				     LWS_HTTP_CHUNK_HDR_MAX_SIZE;
		size_t o = sizeof(mtubuf) - LWS_PRE -
			   LWS_HTTP_CHUNK_HDR_MAX_SIZE -
			   LWS_HTTP_CHUNK_TRL_MAX_SIZE;

		n = lws_http_compression_transform(wsi, buf, len, wp, &out, &o);
		if (n)
			return n;

		lwsl_info("%s: %p: transformed %d bytes to %d "
			   "(wp 0x%x, more %d)\n", __func__, wsi, (int)len,
			   (int)o, (int)*wp, wsi->http.comp_ctx.may_have_more);

		if (!o)
			return olen;

		if (wsi->http.comp_ctx.chunking) {
			char c[LWS_HTTP_CHUNK_HDR_MAX_SIZE + 2];
			/*
			 * this only needs dealing with on http/1.1 to allow
			 * pipelining
			 */
			n = lws_snprintf(c, sizeof(c), "%X\x0d\x0a", (int)o);
			lwsl_info("%s: chunk (%d) %s", __func__, (int)o, c);
			out -= n;
			o += n;
			memcpy(out, c, n);
			out[o++] = '\x0d';
			out[o++] = '\x0a';

			if (((*wp) & 0x1f) == LWS_WRITE_HTTP_FINAL) {
				lwsl_info("%s: final chunk\n", __func__);
				out[o++] = '0';
				out[o++] = '\x0d';
				out[o++] = '\x0a';
				out[o++] = '\x0d';
				out[o++] = '\x0a';
			}
		}

		buf = out;
		len = o;
	}
#endif

	n = lws_issue_raw(wsi, (unsigned char *)buf, len);
	if (n < 0)
		return n;

	/* hide there may have been compression */

	return (int)olen;
}